

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O1

int pkey_rsa_sign(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  void *pvVar1;
  RSA *rsa;
  ulong max_out;
  EVP_MD *md;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  uint out_len;
  
  out_len = (uint)((ulong)in_RAX >> 0x20);
  pvVar1 = ctx->data;
  rsa = *(RSA **)&((EVP_PKEY *)ctx->pkey)->references;
  iVar2 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
  uVar3 = (ulong)iVar2;
  if (sig != (uint8_t *)0x0) {
    max_out = *siglen;
    if (max_out < uVar3) {
      ERR_put_error(6,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                    ,0x8f);
      return 0;
    }
    md = *(EVP_MD **)((long)pvVar1 + 0x18);
    if (md == (EVP_MD *)0x0) {
      iVar2 = RSA_sign_raw(rsa,siglen,sig,max_out,tbs,tbslen,*(int *)((long)pvVar1 + 0x10));
      return iVar2;
    }
    if (*(int *)((long)pvVar1 + 0x10) == 6) {
      iVar2 = RSA_sign_pss_mgf1(rsa,siglen,sig,max_out,tbs,tbslen,(EVP_MD *)md,
                                *(EVP_MD **)((long)pvVar1 + 0x20),*(int *)((long)pvVar1 + 0x28));
      return iVar2;
    }
    if (*(int *)((long)pvVar1 + 0x10) != 1) {
      return 0;
    }
    iVar2 = EVP_MD_type(md);
    iVar2 = RSA_sign(iVar2,tbs,(uint)tbslen,sig,&out_len,(RSA *)rsa);
    if (iVar2 == 0) {
      return 0;
    }
    uVar3 = (ulong)out_len;
  }
  *siglen = uVar3;
  return 1;
}

Assistant:

static int pkey_rsa_sign(EVP_PKEY_CTX *ctx, uint8_t *sig, size_t *siglen,
                         const uint8_t *tbs, size_t tbslen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);
  const size_t key_len = EVP_PKEY_size(ctx->pkey);

  if (!sig) {
    *siglen = key_len;
    return 1;
  }

  if (*siglen < key_len) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (rctx->md) {
    unsigned out_len;
    switch (rctx->pad_mode) {
      case RSA_PKCS1_PADDING:
        if (!RSA_sign(EVP_MD_type(rctx->md), tbs, tbslen, sig, &out_len, rsa)) {
          return 0;
        }
        *siglen = out_len;
        return 1;

      case RSA_PKCS1_PSS_PADDING:
        return RSA_sign_pss_mgf1(rsa, siglen, sig, *siglen, tbs, tbslen,
                                 rctx->md, rctx->mgf1md, rctx->saltlen);

      default:
        return 0;
    }
  }

  return RSA_sign_raw(rsa, siglen, sig, *siglen, tbs, tbslen, rctx->pad_mode);
}